

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# xr_reader.cxx
# Opt level: O3

xr_reader * __thiscall
xray_re::xr_reader::open_chunk_next(xr_reader *this,uint32_t *_id,xr_reader *prev)

{
  uint32_t *puVar1;
  uint32_t uVar2;
  uint32_t *puVar3;
  uint8_t *puVar4;
  uint32_t *puVar5;
  xr_reader *pxVar6;
  _lzhuf *this_00;
  ulong _codesize;
  uint8_t *data;
  size_t real_size;
  uint8_t *local_30;
  size_t local_28;
  
  if (prev == (xr_reader *)0x0) {
    puVar5 = (uint32_t *)this->m_data;
    this->m_next = (uint8_t *)puVar5;
  }
  else {
    (*prev->_vptr_xr_reader[1])(prev);
    puVar5 = (uint32_t *)this->m_next;
  }
  puVar3 = (uint32_t *)this->m_end;
  if (puVar5 < puVar3) {
    puVar1 = puVar5 + 2;
    if (puVar3 < puVar1) {
      __assert_fail("m_next + 8 <= m_end",
                    "/workspace/llm4binary/github/license_c_cmakelists/abramcumner[P]xray_re-tools/sources/xray_re/xr_reader.cxx"
                    ,0x4a,"xr_reader *xray_re::xr_reader::open_chunk_next(uint32_t &, xr_reader *)")
      ;
    }
    (this->field_2).m_p = (uint8_t *)(puVar5 + 1);
    uVar2 = *puVar5;
    (this->field_2).m_p = (uint8_t *)puVar1;
    _codesize = (ulong)puVar5[1];
    if (puVar3 < (uint32_t *)((long)puVar1 + _codesize)) {
      __assert_fail("m_p + size <= m_end",
                    "/workspace/llm4binary/github/license_c_cmakelists/abramcumner[P]xray_re-tools/sources/xray_re/xr_reader.cxx"
                    ,0x4e,"xr_reader *xray_re::xr_reader::open_chunk_next(uint32_t &, xr_reader *)")
      ;
    }
    this->m_next = (uint8_t *)((long)puVar1 + _codesize);
    *_id = uVar2;
    if ((int)uVar2 < 0) {
      puVar4 = (this->field_2).m_p;
      this_00 = &xr_lzhuf::instance()->m_lzhuf;
      _lzhuf::Decode(this_00,&local_30,&local_28,puVar4,_codesize);
      pxVar6 = (xr_reader *)operator_new(0x28);
      pxVar6->m_data = local_30;
      (pxVar6->field_2).m_p = local_30;
      pxVar6->m_next = local_30;
      pxVar6->m_end = local_30 + local_28;
      pxVar6->_vptr_xr_reader = (_func_int **)&PTR__xr_temp_reader_0024a940;
    }
    else {
      pxVar6 = (xr_reader *)operator_new(0x28);
      puVar4 = (this->field_2).m_p;
      pxVar6->_vptr_xr_reader = (_func_int **)&PTR__xr_reader_0024a920;
      pxVar6->m_data = puVar4;
      (pxVar6->field_2).m_p = puVar4;
      pxVar6->m_next = puVar4;
      pxVar6->m_end = puVar4 + _codesize;
    }
  }
  else {
    pxVar6 = (xr_reader *)0x0;
  }
  return pxVar6;
}

Assistant:

xr_reader* xr_reader::open_chunk_next(uint32_t& _id, xr_reader* prev)
{
	if (prev)
		delete prev;
	else
		m_next = m_data;
	if (m_next < m_end) {
		assert(m_next + 8 <= m_end);
		m_p = m_next;
		uint32_t id = r_u32();
		uint32_t size = r_u32();
		assert(m_p + size <= m_end);
		m_next = m_p + size;
		_id = id;
		if (id & CHUNK_COMPRESSED) {
			size_t real_size;
			uint8_t* data;
			xr_lzhuf::decompress(data, real_size, m_p, size);
			return new xr_temp_reader(data, real_size);
		} else {
			return new xr_reader(m_p, size);
		}
	}
	return 0;
}